

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

Array<kj::Promise<void>_> * __thiscall
kj::ArrayBuilder<kj::Promise<void>_>::finish(ArrayBuilder<kj::Promise<void>_> *this)

{
  Promise<void> *pPVar1;
  RemoveConst<kj::Promise<void>_> *pRVar2;
  ArrayDisposer *pAVar3;
  Array<kj::Promise<void>_> *result;
  Array<kj::Promise<void>_> *in_RDI;
  
  pPVar1 = this->ptr;
  pRVar2 = this->pos;
  pAVar3 = this->disposer;
  in_RDI->ptr = pPVar1;
  in_RDI->size_ = (long)pRVar2 - (long)pPVar1 >> 3;
  in_RDI->disposer = pAVar3;
  this->ptr = (Promise<void> *)0x0;
  this->pos = (RemoveConst<kj::Promise<void>_> *)0x0;
  this->endPtr = (Promise<void> *)0x0;
  return in_RDI;
}

Assistant:

Array<T> finish() {
    // We could safely remove this check if we assume that the disposer implementation doesn't
    // need to know the original capacity, as is the case with HeapArrayDisposer since it uses
    // operator new() or if we created a custom disposer for ArrayBuilder which stores the capacity
    // in a prefix.  But that would make it hard to write cleverer heap allocators, and anyway this
    // check might catch bugs.  Probably people should use Vector if they want to build arrays
    // without knowing the final size in advance.
    KJ_IREQUIRE(pos == endPtr, "ArrayBuilder::finish() called prematurely.");
    Array<T> result(reinterpret_cast<T*>(ptr), pos - ptr, *disposer);
    ptr = nullptr;
    pos = nullptr;
    endPtr = nullptr;
    return result;
  }